

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_object_base_name(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  parser_error pVar3;
  void *__src;
  undefined8 *__dest;
  char *pcVar4;
  
  __src = parser_priv(p);
  if (__src != (void *)0x0) {
    __dest = (undefined8 *)mem_alloc(0x98);
    memcpy(__dest,__src,0x98);
    __dest[2] = *(undefined8 *)((long)__src + 0x98);
    *(undefined8 **)((long)__src + 0x98) = __dest;
    pcVar4 = parser_getsym(p,"tval");
    wVar2 = tval_find_idx(pcVar4);
    *(wchar_t *)(__dest + 1) = wVar2;
    if (wVar2 == L'\xffffffff') {
      pVar3 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      _Var1 = parser_hasval(p,"name");
      if (_Var1) {
        pcVar4 = parser_getstr(p,"name");
        pcVar4 = string_make(pcVar4);
        *__dest = pcVar4;
      }
      *(undefined4 *)(__dest + 0x12) = 0;
      pVar3 = PARSE_ERROR_NONE;
    }
    return pVar3;
  }
  __assert_fail("d",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                ,0x1fe,"enum parser_error parse_object_base_name(struct parser *)");
}

Assistant:

static enum parser_error parse_object_base_name(struct parser *p) {
	struct object_base *kb;
	struct kb_parsedata *d = parser_priv(p);

	assert(d);
	kb = mem_alloc(sizeof *kb);
	memcpy(kb, &d->defaults, sizeof(*kb));
	kb->next = d->kb;
	d->kb = kb;

	kb->tval = tval_find_idx(parser_getsym(p, "tval"));
	if (kb->tval == -1) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	if (parser_hasval(p, "name")) {
		kb->name = string_make(parser_getstr(p, "name"));
	}
	kb->num_svals = 0;
	return PARSE_ERROR_NONE;
}